

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendReportedState
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,uchar *reportedState,size_t size,
          IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback,void *userContextCallback)

{
  uint32_t id;
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_TWIN *client_item;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_DEVICE_TWIN *client_data;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback_local;
  size_t size_local;
  uchar *reportedState_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) || (reportedState == (uchar *)0x0))
     || (size == 0)) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendReportedState",0x998,1,
                "Invalid argument specified iothubClientHandle=%p, reportedState=%p, size=%lu",
                iotHubClientHandle,reportedState,size);
    }
  }
  else {
    id = get_next_item_id(iotHubClientHandle);
    client_item = dev_twin_data_create
                            (iotHubClientHandle,id,reportedState,size,reportedStateCallback,
                             userContextCallback);
    if (client_item == (IOTHUB_DEVICE_TWIN *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SendReportedState",0x9a0,1,
                  "Failure constructing device twin data");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else {
      iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin)
                        (iotHubClientHandle->transportHandle);
      if (iVar1 == 0) {
        DList_InsertTailList(&iotHubClientHandle->iot_msg_queue,&client_item->entry);
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_SendReportedState",0x9a7,1,
                    "Failure adding device twin data to queue");
        }
        device_twin_data_destroy(client_item);
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendReportedState(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const unsigned char* reportedState, size_t size, IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL || (reportedState == NULL || size == 0) )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("Invalid argument specified iothubClientHandle=%p, reportedState=%p, size=%lu", iotHubClientHandle, reportedState, (unsigned long)size);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        IOTHUB_DEVICE_TWIN* client_data = dev_twin_data_create(handleData, get_next_item_id(handleData), reportedState, size, reportedStateCallback, userContextCallback);
        if (client_data == NULL)
        {
            LogError("Failure constructing device twin data");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceTwin(handleData->transportHandle) != 0)
            {
                LogError("Failure adding device twin data to queue");
                device_twin_data_destroy(client_data);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                DList_InsertTailList(&(iotHubClientHandle->iot_msg_queue), &(client_data->entry));

                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;
}